

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O2

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::wrapexcept
          (wrapexcept<boost::xpressive::regex_error> *this,regex_error *e,source_location *loc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint_least32_t uVar3;
  undefined1 auVar4 [16];
  
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR___cxa_pure_virtual_00186378;
  xpressive::regex_error::regex_error(&this->super_regex_error,e);
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR_clone_00186300;
  *(undefined ***)&this->super_regex_error = &PTR__wrapexcept_00186330;
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR__wrapexcept_00186358;
  exception::operator=(&(this->super_regex_error).super_exception,&e->super_exception);
  uVar1 = loc->file_;
  uVar2 = loc->function_;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar2;
  auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
  (this->super_regex_error).super_exception.throw_function_ = (char *)uVar2;
  (this->super_regex_error).super_exception.throw_file_ = (char *)auVar4._8_8_;
  uVar3 = loc->column_;
  (this->super_regex_error).super_exception.throw_line_ = loc->line_;
  (this->super_regex_error).super_exception.throw_column_ = uVar3;
  return;
}

Assistant:

explicit wrapexcept( E const & e, boost::source_location const & loc ): E( e )
    {
        copy_from( &e );

        set_info( *this, throw_file( loc.file_name() ) );
        set_info( *this, throw_line( static_cast<int>( loc.line() ) ) );
        set_info( *this, throw_function( loc.function_name() ) );
        set_info( *this, throw_column( static_cast<int>( loc.column() ) ) );
    }